

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  GMM_RESOURCE_FORMAT GVar1;
  GMM_TILE_MODE GVar2;
  uint32_t uVar3;
  PlatformInfo *pPVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  GMM_STATUS GVar8;
  GMM_PLATFORM_INFO *pGVar9;
  Context *pCVar10;
  anon_struct_8_45_9b07292e_for_Gpu aVar11;
  undefined4 extraout_var;
  GMM_GFX_SIZE_T GVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint32_t uVar17;
  uint uVar18;
  ulong uVar19;
  anon_struct_8_44_94931171_for_Info aVar20;
  uint uVar21;
  uint32_t NumSamples;
  int iVar22;
  GMM_STATUS GVar23;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  undefined4 local_34;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGVar9 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                              super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                              super_GmmTextureCalc.pGmmLibContext);
  pTexInfo->TileMode = SUB84((pTexInfo->Flags).Gpu,4) >> 8 & LEGACY_TILE_Y;
  uVar14 = pTexInfo->BitsPerPixel * (int)pTexInfo->BaseWidth;
  local_54 = uVar14 >> 3;
  local_50 = (ulong)local_54;
  GVar1 = pTexInfo->Format;
  pCVar10 = (Context *)(ulong)GVar1;
  uVar21 = pTexInfo->BaseHeight;
  local_40 = (ulong)uVar21;
  uVar16 = 0xffffff97ffffffff;
  uVar19 = 0xffffffc7ffffffff;
  GVar23 = GMM_ERROR;
  switch(GVar1) {
  case GMM_FORMAT_I420:
  case GMM_FORMAT_IYUV:
  case GMM_FORMAT_YV12:
  case GMM_FORMAT_YVU9:
    bVar6 = GVar1 == GMM_FORMAT_YVU9;
    uVar15 = (uint)!bVar6 * 2 | 0xfffffffc;
    uVar15 = ((uVar21 + 1 + (uint)bVar6 * 2 & uVar15) * (local_54 + 1 + (uint)bVar6 * 2 & uVar15) >>
             bVar6 * '\x02' + 2) * 2;
    if (7 < uVar14) {
      uVar15 = ((uVar15 - 1) + uVar21 * local_54 + local_54) / local_54;
    }
    aVar20 = (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffd7fff7ffff | 0x80000);
    (pTexInfo->Flags).Info = aVar20;
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 1;
    if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar16 = 0xffffefd7ffffffff;
    }
    aVar20 = (anon_struct_8_44_94931171_for_Info)(uVar16 & (ulong)aVar20);
    (pTexInfo->Flags).Info = aVar20;
    if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar19 = 0xfffff7d7ffffffff;
    }
    (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar19 & (ulong)aVar20);
    local_34 = 0;
    local_48 = 0;
    goto LAB_001b5db3;
  case GMM_FORMAT_IMC1:
  case GMM_FORMAT_IMC3:
  case GMM_FORMAT_MFX_JPEG_YUV420:
  case GMM_FORMAT_MFX_JPEG_YUV422V:
    uVar14 = uVar21 + 1 >> 1;
    break;
  case GMM_FORMAT_IMC2:
  case GMM_FORMAT_IMC4:
    uVar15 = uVar21 + 0xf & 0xfffffff0;
    local_40 = (ulong)uVar15;
    local_48 = (ulong)(uVar15 >> 1);
    uVar15 = uVar15 + (uVar15 >> 1);
    goto LAB_001b5d62;
  case GMM_FORMAT_L4A4:
  case GMM_FORMAT_P8:
  case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
  case GMM_FORMAT_R24G8_TYPELESS:
  case GMM_FORMAT_R32G8X24_TYPELESS:
  case GMM_FORMAT_RENDER_8BIT:
  case GMM_FORMAT_Y1_UNORM:
  case GMM_FORMAT_Y8_UNORM_VA:
  case GMM_FORMAT_Y16_SNORM:
  case GMM_FORMAT_Y16_UNORM:
  case GMM_FORMAT_Y32_UNORM:
  case GMM_FORMAT_Y210:
  case GMM_FORMAT_Y212:
  case GMM_FORMAT_Y410:
  case GMM_FORMAT_Y412:
  case GMM_FORMAT_Y216:
  case GMM_FORMAT_Y416:
  case GMM_FORMAT_UYVY_2x1:
  case GMM_FORMAT_VYUY_2x1:
  case GMM_FORMAT_YUY2_2x1:
  case GMM_FORMAT_YVYU_2x1:
  case GMM_FORMAT_MEDIA_Y1_UNORM:
  case GMM_FORMAT_MEDIA_Y8_UNORM:
  case GMM_FORMAT_MEDIA_Y16_SNORM:
  case GMM_FORMAT_MEDIA_Y16_UNORM:
  case GMM_FORMAT_MEDIA_Y32_UNORM:
  case GMM_FORMAT_B16G16R16A16_UNORM:
    goto switchD_001b5be0_caseD_155;
  case GMM_FORMAT_MFX_JPEG_YUV411:
  case GMM_FORMAT_MFX_JPEG_YUV422H:
  case GMM_FORMAT_MFX_JPEG_YUV444:
    goto LAB_001b5d8a;
  case GMM_FORMAT_MFX_JPEG_YUV411R:
    uVar14 = uVar21 + 3 >> 2;
    break;
  case GMM_FORMAT_NV11:
  case GMM_FORMAT_P208:
  case GMM_FORMAT_P216:
    uVar15 = uVar21 * 2;
    local_48 = local_40;
    goto LAB_001b5d02;
  case GMM_FORMAT_NV12:
  case GMM_FORMAT_NV21:
  case GMM_FORMAT_P010:
  case GMM_FORMAT_P012:
  case GMM_FORMAT_P016:
    uVar15 = uVar21 + 1 >> 1;
    local_48 = (ulong)uVar15;
    uVar15 = uVar21 + uVar15;
LAB_001b5d02:
    pCVar10 = (Context *)(ulong)(GVar1 - GMM_FORMAT_NV12);
    if ((GVar1 - GMM_FORMAT_NV12 < 0x24) && ((0x80000007bU >> ((ulong)pCVar10 & 0x3f) & 1) != 0)) {
LAB_001b5d62:
      local_54 = local_54 + 1 & 0xfffffffe;
      local_50 = (ulong)local_54;
      (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 2;
    }
    else {
      aVar20 = (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffd7fff7ffff | 0x80000);
      (pTexInfo->Flags).Info = aVar20;
      if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                   super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                  pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
        uVar16 = 0xffffefd7ffffffff;
      }
      aVar20 = (anon_struct_8_44_94931171_for_Info)(uVar16 & (ulong)aVar20);
      (pTexInfo->Flags).Info = aVar20;
      pCVar10 = (this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext;
      if (((uint)(pCVar10->SkuTable).field_0 & 0x40) == 0) {
        aVar20 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar20 & 0xfffff7d7ffffffff);
      }
      else {
        aVar20 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar20 & 0xffffffc7ffffffff);
      }
      (pTexInfo->Flags).Info = aVar20;
    }
    local_34 = (undefined4)CONCAT71((int7)((ulong)pCVar10 >> 8),1);
    goto LAB_001b5db3;
  case GMM_FORMAT_RGBP:
    goto switchD_001b5be0_caseD_168;
  default:
    if (GVar1 != GMM_FORMAT_BGRP) {
      return GMM_ERROR;
    }
    goto switchD_001b5be0_caseD_168;
  }
  uVar14 = uVar14 + 0xf & 0xfffffff0;
  local_48 = (ulong)uVar14;
  uVar15 = uVar21 + 0xf & 0xfffffff0;
  local_40 = (ulong)uVar15;
  uVar15 = uVar15 + uVar14 * 2;
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 3;
  local_34 = 0;
LAB_001b5db3:
  GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,pTexInfo);
  aVar11 = (pTexInfo->Flags).Gpu;
  if (((aVar11._0_4_ >> 0x10 & 1) != 0) && (((ulong)(pTexInfo->Flags).Info & 0x185000000000) == 0))
  {
    aVar11 = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar11 & 0xfffffffffffeffff);
    (pTexInfo->Flags).Gpu = aVar11;
  }
  aVar20 = (pTexInfo->Flags).Info;
  if ((((ulong)aVar20 & 0x185000000000) == 0 & (byte)(((ulong)aVar11 & 0xffffffff) >> 1) & 0x7f) ==
      1) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar11 & 0xfffffddffffefffd);
  }
  if (((aVar20._0_4_ >> 0x13 & 1) != 0) && (((uint)(pTexInfo->Flags).Wa & 0x10) == 0)) {
    uVar21 = pRestrictions->PitchAlignment;
    uVar14 = pRestrictions->RenderPitchAlignment;
    uVar18 = pRestrictions->LockPitchAlignment;
    uVar5 = pRestrictions->MinPitch;
    pRestrictions->PitchAlignment = (uint)(uVar21 < 0x40) * 0x40 | (uVar21 >= 0x40) * uVar21;
    pRestrictions->RenderPitchAlignment = (uint)(uVar14 < 0x40) * 0x40 | (uVar14 >= 0x40) * uVar14;
    pRestrictions->LockPitchAlignment = (uint)(uVar18 < 0x40) * 0x40 | (uVar18 >= 0x40) * uVar18;
    pRestrictions->MinPitch = (uint)(uVar5 < 0x40) * 0x40 | (uVar5 >= 0x40) * uVar5;
  }
  uVar21 = pTexInfo->Format - GMM_FORMAT_I420;
  if ((uVar21 < 0x27) && ((0x6000002003U >> ((ulong)uVar21 & 0x3f) & 1) != 0)) {
    pRestrictions->PitchAlignment =
         pRestrictions->PitchAlignment << (pTexInfo->Format == GMM_FORMAT_YVU9) + 1;
    pRestrictions->RenderPitchAlignment = pRestrictions->RenderPitchAlignment;
    pRestrictions->LockPitchAlignment = pRestrictions->LockPitchAlignment;
    pRestrictions->MinPitch = pRestrictions->MinPitch;
  }
  uVar21 = uVar15 + 1 & 0xfffffffe;
  GmmTextureCalc::FindMipTailStartLod((GmmTextureCalc *)this,pTexInfo);
  if ((((((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
          super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext)->WaTable).field_0x9 & 0x10)
       == 0) || (bVar6 = GmmIsYUVFormatLCUAligned(pTexInfo->Format), !bVar6)) {
    uVar15 = (uint)local_48;
    uVar14 = uVar15;
  }
  else {
    uVar15 = (uint)local_48;
    if (uVar15 == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = uVar15 + 0x3f & 0xffffffc0;
      uVar21 = (uVar14 - uVar15) + uVar21;
    }
  }
  GVar2 = pTexInfo->TileMode;
  aVar11 = (pTexInfo->Flags).Gpu;
  uVar16 = local_50;
  if (pGVar9->TileInfo[GVar2].LogicalSize == 0) {
    if (((ulong)aVar11 >> 0x29 & 1) != 0) goto LAB_001b5f27;
  }
  else if (((ulong)aVar11 >> 0x29 & 1) == 0) {
    pPVar4 = ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo;
    uVar21 = (pPVar4->Data).TileInfo[GVar2].LogicalTileWidth;
    uVar17 = (pPVar4->Data).TileInfo[GVar2].LogicalTileHeight;
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.IsTileAlignedPlanes = true;
    if ((((ulong)aVar11 & 2) != 0) &&
       (pCVar10 = (this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                  super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                  pGmmLibContext, ((pCVar10->SkuTable).field_1.field_0x3 & 2) == 0)) {
      uVar19 = *(ulong *)&(pCVar10->WaTable).field_0x4;
      if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1040) == 0) {
        bVar13 = ((uVar19 >> 0x2f & 1) == 0) << 2 | 2;
        if ((uVar19 >> 0x2e & 1) != 0) {
          bVar13 = 0;
        }
      }
      else {
        bVar13 = ((uVar19 & 0xc00000000000) == 0) << 2;
      }
      uVar17 = uVar17 << bVar13;
    }
    if ((pTexInfo->Format == GMM_FORMAT_IMC4) || (pTexInfo->Format == GMM_FORMAT_IMC2)) {
      uVar19 = local_50;
      if (uVar21 != 0) {
        uVar19 = (ulong)((uVar21 - 1) + (int)local_50) / (ulong)uVar21;
      }
      if ((uVar19 & 1) != 0) {
        local_54 = ((int)uVar19 + 1) * uVar21;
        uVar16 = (ulong)local_54;
      }
    }
    iVar22 = uVar17 - 1;
    uVar18 = -uVar17;
    if ((char)local_34 == '\0') {
      uVar21 = (uVar14 + iVar22 & uVar18) + (uVar15 + iVar22 & uVar18);
    }
    else {
      uVar21 = iVar22 + uVar14 & uVar18;
    }
    uVar21 = uVar21 + ((uVar17 - 1) + (int)local_40 & uVar18);
    aVar20 = (pTexInfo->Flags).Info;
    if (((ulong)aVar20 & 0x106000000000) != 0) {
      (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)((ulong)aVar20 | 0x10000000);
    }
  }
  else {
LAB_001b5f27:
    if ((pTexInfo->Format == GMM_FORMAT_IMC4) || (pTexInfo->Format == GMM_FORMAT_IMC2)) {
      uVar21 = pTexInfo->CCSModeAlign + 0xd;
      uVar15 = pTexInfo->CCSModeAlign + 0x12;
      uVar14 = 0;
      if (0xb < uVar15) {
        uVar14 = uVar15;
      }
      if (uVar21 < 8) {
        uVar14 = uVar21;
      }
      uVar17 = pGVar9->TileInfo[uVar14].LogicalTileWidth;
      uVar16 = (ulong)(uVar17 * -2 & (int)local_50 + -1 + uVar17 * 2);
    }
    NumSamples = 1;
    uVar17 = NumSamples;
    if (((ulong)aVar11 & 0x20000040) != 0) {
      uVar17 = (pTexInfo->MSAA).NumSamples;
    }
    uVar3 = (((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo->Data).
            TileInfo[GVar2].LogicalTileHeight;
    uVar17 = GmmTextureCalc::ExpandWidth
                       ((GmmTextureCalc *)this,
                        (uint32_t)((uVar16 & 0xffffffff) / (ulong)(pTexInfo->BitsPerPixel >> 3)),
                        (pTexInfo->Alignment).HAlign,uVar17);
    local_54 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                 _vptr_GmmTextureCalc[0x16])(this,pTexInfo,(ulong)uVar17);
    local_50 = CONCAT44(extraout_var,local_54);
    uVar17 = NumSamples;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar17 = (pTexInfo->MSAA).NumSamples;
    }
    uVar17 = GmmTextureCalc::ExpandHeight
                       ((GmmTextureCalc *)this,(uint32_t)local_40,(pTexInfo->Alignment).VAlign,
                        uVar17);
    iVar22 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc
               .super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x17])
                       (this,pTexInfo,(ulong)uVar17);
    local_40 = CONCAT44(local_40._4_4_,uVar3 - 1);
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      NumSamples = (pTexInfo->MSAA).NumSamples;
    }
    uVar17 = GmmTextureCalc::ExpandHeight
                       ((GmmTextureCalc *)this,(uint32_t)local_48,(pTexInfo->Alignment).VAlign,
                        NumSamples);
    iVar7 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
              super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x17])
                      (this,pTexInfo,(ulong)uVar17);
    uVar21 = (iVar7 + (int)local_40 & -uVar3) + (iVar22 + -1 + uVar3 & -uVar3);
    uVar16 = local_50;
  }
  if (((pTexInfo->Flags).Info.field_0x3 & 0x10) != 0) {
    GmmTextureCalc::RedescribeTexturePlanes((GmmTextureCalc *)this,pTexInfo,&local_54);
    uVar16 = (ulong)local_54;
  }
  GVar8 = GmmTextureCalc::FillTexPitchAndSize
                    ((GmmTextureCalc *)this,pTexInfo,uVar16 & 0xffffffff,uVar21,pRestrictions);
  if (GVar8 == GMM_SUCCESS) {
    (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
      super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x28])(this,pTexInfo);
  }
  GVar23 = GVar8;
  if (1 < (ulong)pTexInfo->ArraySize) {
    GVar12 = (ulong)pTexInfo->ArraySize * pTexInfo->Size;
    GVar23 = GMM_ERROR;
    if (GVar12 - pGVar9->SurfaceMaxSize == 0 || (long)GVar12 < pGVar9->SurfaceMaxSize) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = pTexInfo->Size;
      pTexInfo->Size = GVar12;
      GVar23 = GVar8;
    }
  }
switchD_001b5be0_caseD_155:
  return GVar23;
switchD_001b5be0_caseD_168:
  if (((pTexInfo->Flags).Info.field_0x2 & 8) == 0) {
LAB_001b5d8a:
    local_40 = (ulong)(uVar21 + 0xf & 0xfffffff0);
  }
  uVar15 = (int)local_40 * 3;
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 3;
  local_34 = 0;
  local_48 = local_40;
  goto LAB_001b5db3;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar(GMM_TEXTURE_INFO * pTexInfo,
                                                                   __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   WidthBytesPhysical, Height, YHeight, VHeight;
    uint32_t   AdjustedVHeight = 0;
    GMM_STATUS Status;
    bool       UVPacked = false;
    uint32_t   BitsPerPixel, AlignedWidth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(!pTexInfo->Flags.Info.TiledW);
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    AlignedWidth = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    if(!pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        pTexInfo->TileMode = TILE_NONE;
    }
    else
    {
        pTexInfo->TileMode = LEGACY_TILE_Y;
    }

    WidthBytesPhysical = AlignedWidth * BitsPerPixel >> 3;
    Height = VHeight = 0;

    YHeight = pTexInfo->BaseHeight;

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1: // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420: // Same as IMC3.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight; // One VHeight for V and one for U.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //UUUUUUUU
            //VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411: // Similar to IMC3 but U/V are quarter width and full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UU
        // UU
        // UU
        // UU
        // VV
        // VV
        // VV
        // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
#if _WIN32
        case GMM_FORMAT_WGBOX_YUV444:
        case GMM_FORMAT_WGBOX_PLANAR_YUV444:
#endif
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            else
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            break;
        }
        case GMM_FORMAT_IMC2: // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            VHeight = GFX_CEIL_DIV(YHeight, 2);

            WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.

            Height = YHeight + VHeight;

            // With SURFACE_STATE.XOffset support, the U-V interface has
            // much lighter restrictions--which will be naturally met by
            // surface pitch restrictions (i.e. dividing an IMC2/4 pitch
            // by 2--to get the U/V interface--will always produce a safe
            // XOffset value).
            // Not technically UV packed but sizing works out the same
            // if the resource is std swizzled
            UVPacked                                    = true;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(YHeight, 2); // U/V plane half of Y
                Height  = YHeight + VHeight;
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
                Height  = YHeight + VHeight;
            }

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016) ||
               (pTexInfo->Format == GMM_FORMAT_P208) ||
               (pTexInfo->Format == GMM_FORMAT_P216))
            {
                WidthBytesPhysical                          = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            }
            else //if(pTexInfo->Format == GMM_FORMAT_NV11)
            {
                // Tiling not supported, since YPitch != UVPitch...
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.Linear  = 1;
                GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
                GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            }

            UVPacked = true;
            break;
        }
        case GMM_FORMAT_I420: // IYUV & I420: are identical to YV12 except,
        case GMM_FORMAT_IYUV: // U & V pl.s are reversed.
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, UVSize, YVSizeRShift;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = WidthBytesPhysical * YHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(WidthBytesPhysical, YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(YHeight, YSizeForUVPurposesDimensionalAlignment);

            UVSize = 2 * // <-- U + V
                     (YSizeForUVPurposes >> YVSizeRShift);

            Height = GFX_CEIL_DIV(YSize + UVSize, WidthBytesPhysical);

            // Tiling not supported, since YPitch != UVPitch...
            pTexInfo->Flags.Info.TiledYf                = 0;
            pTexInfo->Flags.Info.TiledX                 = 0;
            pTexInfo->Flags.Info.Linear                 = 1;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 1;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unexpected format");
            return GMM_ERROR;
        }
    }

    // Align Height to even row to avoid hang if HW over-fetch
    Height = GFX_ALIGN(Height, __GMM_EVEN_ROW);

    SetTileMode(pTexInfo);

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable MMC during such cases.
    if(pTexInfo->Flags.Gpu.MMC)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable .CCS/UnifiedAuxSurface during such cases.
    if(pTexInfo->Flags.Gpu.CCS)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           !(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs && GMM_IS_4KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC               = 0;
            pTexInfo->Flags.Gpu.CCS               = 0;
            pTexInfo->Flags.Gpu.UnifiedAuxSurface = 0;
            pTexInfo->Flags.Gpu.__NonMsaaTileYCcs = 0;
        }
    }

    // Legacy Planar "Linear Video" Restrictions...
    if(pTexInfo->Flags.Info.Linear && !pTexInfo->Flags.Wa.NoLegacyPlanarLinearVideoRestrictions)
    {
        pRestrictions->LockPitchAlignment   = GFX_MAX(pRestrictions->LockPitchAlignment, GMM_BYTES(64));
        pRestrictions->MinPitch             = GFX_MAX(pRestrictions->MinPitch, GMM_BYTES(64));
        pRestrictions->PitchAlignment       = GFX_MAX(pRestrictions->PitchAlignment, GMM_BYTES(64));
        pRestrictions->RenderPitchAlignment = GFX_MAX(pRestrictions->RenderPitchAlignment, GMM_BYTES(64));
    }

    // Multiply overall pitch alignment for surfaces whose U/V planes have a
    // pitch down-scaled from that of Y--Since the U/V pitches must meet the
    // original restriction, the Y pitch must meet a scaled-up multiple.
    if((pTexInfo->Format == GMM_FORMAT_I420) ||
       (pTexInfo->Format == GMM_FORMAT_IYUV) ||
       (pTexInfo->Format == GMM_FORMAT_NV11) ||
       (pTexInfo->Format == GMM_FORMAT_YV12) ||
       (pTexInfo->Format == GMM_FORMAT_YVU9))
    {
        uint32_t LShift =
        (pTexInfo->Format != GMM_FORMAT_YVU9) ?
        1 : // UVPitch = 1/2 YPitch
        2;  // UVPitch = 1/4 YPitch

        pRestrictions->LockPitchAlignment <<= LShift;
        pRestrictions->MinPitch <<= LShift;
        pRestrictions->PitchAlignment <<= LShift;
        pRestrictions->RenderPitchAlignment <<= LShift;
    }

    AdjustedVHeight = VHeight;

    FindMipTailStartLod(pTexInfo);

    // In case of Planar surfaces, only the last Plane has to be aligned to 64 for LCU access
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU && GmmIsYUVFormatLCUAligned(pTexInfo->Format) && VHeight > 0)
    {
        AdjustedVHeight = GFX_ALIGN(VHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
        Height += AdjustedVHeight - VHeight;
    }

    // For std swizzled and UV packed tile Ys/Yf cases, the planes
    // must be tile-boundary aligned. Actual alignment is handled
    // in FillPlanarOffsetAddress, but height and width must
    // be adjusted for correct size calculation
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) &&
       !pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uint32_t TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        pTexInfo->OffsetInfo.PlaneXe_LPG.IsTileAlignedPlanes = true;

        if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) // alignment adjustment needed only for aux tables
        {
            if(GMM_IS_64KB_TILE(pTexInfo->Flags))
            {
                TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
            }
            else
            {
                TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64); // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
            }
        }

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
            // If the U & V planes are side-by-side then the surface pitch must be
            // padded out so that U and V planes will being on a tile boundary.
            // This means that an odd Y plane width must be padded out
            // with an additional tile. Even widths do not need padding
            uint32_t TileCols = GFX_CEIL_DIV(WidthBytesPhysical, TileWidth);
            if(TileCols % 2)
            {
                WidthBytesPhysical = (TileCols + 1) * TileWidth;
            }
        }

        Height = GFX_ALIGN(YHeight, TileHeight) + (UVPacked ? GFX_ALIGN(AdjustedVHeight, TileHeight) :
                                                              (GFX_ALIGN(VHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight)));

        if(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf)
        {
            pTexInfo->Flags.Info.RedecribedPlanes = true;
        }
    }
    else if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;

        BitsPerPixel = 8;

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
// If the U & V planes are side-by-side then the surface pitch must be
// padded out so that U and V planes will being on a tile boundary.
// This means that an odd Y plane width must be padded out
// with an additional tile. Even widths do not need padding

// CCS must use padded main surface width, so get main surface TileWidth
#define CCSMODE_TO_TILEMODE(y) ((y + TILE_YF_2D_8bpe) < TILE_YS_1D_8bpe) ? (y + TILE_YF_2D_8bpe) : \
                                                                           ((y + TILE_YF_2D_8bpe + 5) >= TILE_YS_1D_128bpe) ? (y + TILE_YF_2D_8bpe + 5) : TILE_NONE

            uint32_t BaseTileWidth = pPlatform->TileInfo[CCSMODE_TO_TILEMODE(pTexInfo->CCSModeAlign)].LogicalTileWidth;
            WidthBytesPhysical     = GFX_ALIGN(WidthBytesPhysical, 2 * BaseTileWidth);
        }

        AlignedWidth = GFX_ULONG_CAST(WidthBytesPhysical / (pTexInfo->BitsPerPixel >> 3));

        WidthBytesPhysical = __GMM_EXPAND_WIDTH(this, AlignedWidth, pTexInfo->Alignment.HAlign, pTexInfo);
        WidthBytesPhysical = ScaleTextureWidth(pTexInfo, WidthBytesPhysical); //Should both YAux and UVAux use same CCModeALign (ie using common bpe?)
                                                                              //If different, then copy Aux info from per-plane Aux? HW has separate bpe or common?
        YHeight = __GMM_EXPAND_HEIGHT(this, YHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        YHeight = ScaleTextureHeight(pTexInfo, YHeight);
        YHeight = GFX_ALIGN(YHeight, TileHeight);

        VHeight = __GMM_EXPAND_HEIGHT(this, VHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        VHeight = ScaleTextureHeight(pTexInfo, VHeight);
        VHeight = GFX_ALIGN(VHeight, TileHeight);

        Height = YHeight + VHeight;
    }

    if(pTexInfo->Flags.Info.RedecribedPlanes)
    {
        if(false == RedescribeTexturePlanes(pTexInfo, &WidthBytesPhysical))
        {
            __GMM_ASSERT(false);
        }
    }
    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Height, pRestrictions)) == GMM_SUCCESS)
    {
        FillPlanarOffsetAddress(pTexInfo);
    }

    // Planar & hybrid 2D arrays supported in DX11.1+ spec but not HW. Memory layout
    // is defined by SW requirements; Y plane must be 4KB aligned.
    if(pTexInfo->ArraySize > 1)
    {
        GMM_GFX_SIZE_T ElementSizeBytes = pTexInfo->Size;
        int64_t        LargeSize;

        // Size should always be page aligned.
        __GMM_ASSERT((pTexInfo->Size % PAGE_SIZE) == 0);

        if((LargeSize = (int64_t)ElementSizeBytes * pTexInfo->ArraySize) <= pPlatform->SurfaceMaxSize)
        {
            pTexInfo->OffsetInfo.PlaneXe_LPG.ArrayQPitch = ElementSizeBytes;
            pTexInfo->Size                               = LargeSize;
        }
        else
        {
            GMM_ASSERTDPF(0, "Surface too large!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return (Status);
}